

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
::insert_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
          (hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,index_pointer node,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  database *this_00;
  signature_type __p;
  __type_conflict _Var1;
  address aVar2;
  uint64_t uVar3;
  index_pointer leaf;
  internal_node *piVar4;
  index_pointer *piVar5;
  address *paVar6;
  address addr;
  uint shifts_00;
  size_t sVar7;
  _Alloc_hider _Var8;
  undefined7 uVar10;
  ulong uVar9;
  index_pointer node_00;
  pair<pstore::index::details::index_pointer,_unsigned_long> pVar11;
  pair<pstore::index::details::index_pointer,_bool> pVar12;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar13;
  internal_node *internal;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_90;
  address local_88;
  key_type existing_key;
  index_pointer node_local;
  shared_ptr<const_pstore::index::details::internal_node> iptr;
  signature_type local_40;
  shared_ptr<const_pstore::index::details::internal_node> *local_38;
  
  local_88.a_ = (value_type)this;
  node_local = node;
  if (((ulong)node.internal_ & 1) == 0) {
    this_00 = transaction->db_;
    addr.a_ = (value_type)value;
    aVar2 = details::index_pointer::to_address((index_pointer *)&node_local.addr_);
    hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::get_key(&existing_key,
              (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,(database *)aVar2.a_,addr);
    _Var1 = std::operator==(&value->first,&existing_key);
    aVar2.a_ = local_88.a_;
    if (_Var1) {
      uVar10 = (undefined7)(hash >> 8);
      if (is_upsert) {
        node.addr_ = store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                               ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                                 *)transaction,(transaction_base *)value,
                                (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)parents.ptr_,
                                (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                                 )addr.a_);
        uVar9 = CONCAT71(uVar10,1);
      }
      else {
        iptr.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = node_local.internal_;
        iptr.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
        array_stack<pstore::index::details::parent_type,_13UL>::push
                  (parents.ptr_,(value_type *)&iptr);
        uVar9 = CONCAT71(uVar10,1);
        node = node_local;
      }
    }
    else {
      uVar3 = anon_unknown.dwarf_13be9a::hash_function::operator()
                        ((hash_function *)(local_88.a_ + 0x28),&existing_key);
      node = insert_into_leaf<std::pair<std::__cxx11::string,std::__cxx11::string>>
                       ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                         *)aVar2.a_,transaction,&node_local,value,uVar3 >> ((byte)shifts & 0x3f),
                        hash,shifts,parents);
      uVar9 = 0;
    }
    std::__cxx11::string::~string((string *)&existing_key);
  }
  else {
    local_90 = value;
    if (shifts < 0x42) {
      iptr.
      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      iptr.
      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      internal = (internal_node *)0x0;
      details::internal_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                  *)&existing_key,transaction->db_,node);
      local_38 = &iptr;
      local_40._M_elems = (_Type)&internal;
      std::
      tuple<std::shared_ptr<pstore::index::details::internal_node_const>&,pstore::index::details::internal_node_const*&>
      ::operator=((tuple<std::shared_ptr<pstore::index::details::internal_node_const>&,pstore::index::details::internal_node_const*&>
                   *)&local_40,
                  (pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                   *)&existing_key);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&existing_key._M_string_length);
      if (internal == (internal_node *)0x0) {
        assert_failed("internal != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                      ,0x32c);
      }
      pVar11 = details::internal_node::lookup(internal,(ulong)((uint)hash & 0x3f));
      sVar7 = pVar11.second;
      if (sVar7 == 0xffffffffffffffff) {
        piVar4 = details::internal_node::
                 make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                           (*(chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>
                              **)(local_88.a_ + 8),node,internal);
        leaf.addr_.a_ =
             store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                       ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                         *)transaction,(transaction_base *)local_90,
                        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)parents.ptr_,
                        (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>)
                        value);
        details::internal_node::insert_child(piVar4,hash,leaf,parents);
        node.internal_ = piVar4 | 3;
        uVar9 = 0;
      }
      else {
        pVar12 = insert_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                           ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                             *)local_88.a_,transaction,pVar11.first,local_90,hash >> 6,shifts + 6,
                            parents,is_upsert);
        uVar9 = (ulong)pVar12._8_4_;
        if ((index_pointer)pVar12.first.internal_ != pVar11.first) {
          piVar4 = details::internal_node::
                   make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                             (*(chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>
                                **)(local_88.a_ + 8),node,internal);
          piVar5 = details::internal_node::operator[](piVar4,sVar7);
          node_00.addr_.a_._4_4_ = 0;
          node_00.addr_.a_._0_4_ = shifts + 6;
          hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::delete_node((hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)piVar5->internal_,node_00,shifts_00);
          piVar5->internal_ = (internal_node *)pVar12.first;
          node.internal_ = piVar4 | 3;
        }
        existing_key._M_dataplus._M_p = (pointer)node;
        existing_key._M_string_length = sVar7;
        array_stack<pstore::index::details::parent_type,_13UL>::push
                  (parents.ptr_,(value_type *)&existing_key);
      }
    }
    else {
      iptr.
      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      iptr.
      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      internal = (internal_node *)0x0;
      details::linear_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                  *)&existing_key,transaction->db_,node);
      local_38 = &iptr;
      local_40._M_elems = (_Type)&internal;
      std::
      tuple<std::shared_ptr<pstore::index::details::linear_node_const>&,pstore::index::details::linear_node_const*&>
      ::operator=((tuple<std::shared_ptr<pstore::index::details::linear_node_const>&,pstore::index::details::linear_node_const*&>
                   *)&local_40,
                  (pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                   *)&existing_key);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&existing_key._M_string_length);
      if (internal == (internal_node *)0x0) {
        assert_failed("orig_node != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                      ,0x368);
      }
      pVar13 = details::linear_node::
               lookup<std::__cxx11::string,std::__cxx11::string,std::equal_to<std::__cxx11::string>,void>
                         ((linear_node *)internal,transaction->db_,local_90);
      sVar7 = pVar13.second;
      if (sVar7 == 0xffffffffffffffff) {
        details::linear_node::allocate_from((linear_node *)&existing_key,(linear_node *)internal,1);
        sVar7 = internal->bitmap_;
        aVar2 = store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                            *)transaction,(transaction_base *)local_90,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)parents.ptr_,
                           (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                            )value);
        paVar6 = details::linear_node::operator[]
                           ((linear_node *)existing_key._M_dataplus._M_p,sVar7);
        _Var8 = existing_key._M_dataplus;
        paVar6->a_ = aVar2.a_;
        existing_key._M_dataplus._M_p = (pointer)0x0;
        node.internal_ = (internal_node *)((ulong)_Var8._M_p | 3);
        std::
        unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
        ::~unique_ptr((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                       *)&existing_key);
        uVar9 = 0;
      }
      else {
        uVar10 = (undefined7)((ulong)transaction >> 8);
        if (is_upsert) {
          existing_key._M_dataplus._M_p = (pointer)0x0;
          if (((ulong)node.internal_ & 2) == 0) {
            details::linear_node::allocate_from((linear_node *)&local_40,(linear_node *)internal,0);
            __p._M_elems = local_40._M_elems;
            local_40._M_elems[0] = '\0';
            local_40._M_elems[1] = '\0';
            local_40._M_elems[2] = '\0';
            local_40._M_elems[3] = '\0';
            local_40._M_elems[4] = '\0';
            local_40._M_elems[5] = '\0';
            local_40._M_elems[6] = '\0';
            local_40._M_elems[7] = '\0';
            std::
            __uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
            ::reset((__uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                     *)&existing_key,(pointer)__p._M_elems);
            std::
            unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
            ::~unique_ptr((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                           *)&local_40);
            node.internal_ = (internal_node *)((ulong)existing_key._M_dataplus._M_p | 3);
            _Var8 = existing_key._M_dataplus;
          }
          else {
            _Var8._M_p = (pointer)((ulong)node.internal_ & 0xfffffffffffffffc);
          }
          aVar2 = store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
                              *)transaction,(transaction_base *)local_90,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)parents.ptr_,
                             (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                              )value);
          paVar6 = details::linear_node::operator[]((linear_node *)_Var8._M_p,sVar7);
          paVar6->a_ = aVar2.a_;
          existing_key._M_dataplus._M_p = (pointer)0x0;
          std::
          unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
          ::~unique_ptr((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                         *)&existing_key);
          uVar9 = CONCAT71(uVar10,1);
        }
        else {
          existing_key._M_dataplus._M_p =
               (pointer)details::linear_node::operator[]((linear_node *)internal,sVar7);
          existing_key._M_string_length = 0xffffffffffffffff;
          array_stack<pstore::index::details::parent_type,_13UL>::push
                    (parents.ptr_,(value_type *)&existing_key);
          uVar9 = CONCAT71(uVar10,1);
        }
      }
      existing_key._M_dataplus._M_p = (pointer)node;
      existing_key._M_string_length = sVar7;
      array_stack<pstore::index::details::parent_type,_13UL>::push
                (parents.ptr_,(value_type *)&existing_key);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&iptr.
                super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  pVar12._8_8_ = uVar9 & 0xffffffff;
  pVar12.first.internal_ = node.internal_;
  return pVar12;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_node (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;
            if (node.is_leaf ()) { // This node is a leaf node.
                key_type const existing_key =
                    get_key (transaction.db (), node.to_address ()); // Read key.
                if (equal_ (value.first, existing_key)) {
                    if (is_upsert) {
                        result = this->store_leaf_node (transaction, value, parents);
                    } else {
                        parents->push (details::parent_type{node});
                        result = node;
                    }
                    key_exists = true;
                } else {
                    auto const existing_hash =
                        static_cast<hash_type> ((hash_ (existing_key) >> shifts));
                    result = this->insert_into_leaf (transaction, node, value, existing_hash, hash,
                                                     shifts, parents);
                }
            } else {
                // This node is an internal or a linear node.
                if (details::depth_is_internal_node (shifts)) {
                    std::tie (result, key_exists) = this->insert_into_internal (
                        transaction, node, value, hash, shifts, parents, is_upsert);
                } else {
                    std::tie (result, key_exists) =
                        this->insert_into_linear (transaction, node, value, parents, is_upsert);
                }
            }

            return std::make_pair (result, key_exists);
        }